

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::TokenManager::GetKeyId
          (Error *__return_storage_ptr__,TokenManager *this,ByteArray *aKeyId)

{
  ErrorCode EVar1;
  Error *pEVar2;
  TokenManager *this_00;
  CborMap token;
  CborValue local_60;
  undefined1 local_48 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  CborMap::CborMap((CborMap *)&local_60);
  ValidateToken((Error *)local_48,this,(CborMap *)&local_60,&this->mSignedToken,
                &this->mDomainCAPublicKey);
  this_00 = (TokenManager *)local_48;
  pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)this_00);
  EVar1 = pEVar2->mCode;
  std::__cxx11::string::~string((string *)(local_48 + 8));
  if (EVar1 == kNone) {
    GetKeyId((Error *)local_48,this_00,aKeyId,(CborMap *)&local_60);
    Error::operator=(__return_storage_ptr__,(Error *)local_48);
    std::__cxx11::string::~string((string *)(local_48 + 8));
  }
  CborValue::Free(&local_60);
  return __return_storage_ptr__;
}

Assistant:

Error TokenManager::GetKeyId(ByteArray &aKeyId) const
{
    Error   error;
    CborMap token;

    SuccessOrExit(error = ValidateToken(token, mSignedToken, mDomainCAPublicKey));
    SuccessOrExit(error = GetKeyId(aKeyId, token));

exit:
    token.Free();
    return error;
}